

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O3

optional<pbrt::LightLeSample> * __thiscall
pbrt::ImageInfiniteLight::SampleLe
          (optional<pbrt::LightLeSample> *__return_storage_ptr__,ImageInfiniteLight *this,Point2f u1
          ,Point2f u2,SampledWavelengths *lambda,Float time)

{
  Float FVar1;
  Float FVar2;
  Float FVar3;
  Float FVar4;
  float fVar5;
  Float FVar6;
  undefined4 uVar7;
  undefined4 uVar9;
  undefined8 uVar8;
  undefined1 auVar10 [16];
  bool bVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  float fVar15;
  float fVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined4 uVar24;
  undefined1 auVar25 [16];
  undefined1 in_register_00001248 [56];
  undefined1 auVar26 [64];
  undefined1 auVar29 [60];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar31 [16];
  float fVar32;
  undefined1 auVar33 [16];
  float fVar34;
  float fVar35;
  float fVar37;
  float fVar38;
  undefined1 auVar36 [16];
  float fVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  Vector3f VVar43;
  SampledSpectrum SVar44;
  Float mapPDF;
  Float local_dc;
  undefined1 local_d8 [8];
  float fStack_d0;
  float fStack_cc;
  undefined1 local_c8 [8];
  float fStack_c0;
  float fStack_bc;
  undefined1 local_b8 [16];
  Float local_a8 [4];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  Tuple2<pbrt::Point2,_float> local_20;
  undefined1 extraout_var [56];
  undefined1 auVar23 [56];
  undefined1 auVar30 [56];
  
  auVar26._8_56_ = in_register_00001248;
  auVar26._0_8_ = u2.super_Tuple2<pbrt::Point2,_float>;
  auVar19._8_56_ = in_register_00001208;
  auVar19._0_8_ = u1.super_Tuple2<pbrt::Point2,_float>;
  _local_d8 = auVar26._0_16_;
  local_20 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar19._0_16_);
  auVar20._0_8_ = PiecewiseConstant2D::Sample(&this->distribution,(Point2f *)&local_20,&local_dc);
  auVar29 = auVar26._4_60_;
  auVar20._8_56_ = extraout_var;
  local_38 = auVar20._0_16_;
  auVar23 = extraout_var;
  VVar43 = EqualAreaSquareToSphere(auVar20._0_8_);
  auVar27._0_4_ = VVar43.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar27._4_60_ = auVar29;
  auVar21._0_8_ = VVar43.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar21._8_56_ = auVar23;
  local_88 = auVar21._0_16_;
  local_a8 = (this->super_LightBase).renderFromLight.m.m[0];
  _local_c8 = *(undefined1 (*) [16])((this->super_LightBase).renderFromLight.m.m[0] + 1);
  local_98 = *(undefined1 (*) [16])((this->super_LightBase).renderFromLight.m.m[0] + 2);
  FVar1 = (this->super_LightBase).renderFromLight.m.m[1][0];
  FVar2 = (this->super_LightBase).renderFromLight.m.m[1][1];
  FVar3 = (this->super_LightBase).renderFromLight.m.m[1][2];
  FVar4 = (this->super_LightBase).renderFromLight.m.m[2][0];
  fVar5 = (this->super_LightBase).renderFromLight.m.m[2][1];
  FVar6 = (this->super_LightBase).renderFromLight.m.m[2][2];
  auVar12._0_4_ = (float)local_d8._0_4_ + (float)local_d8._0_4_;
  auVar12._4_4_ = (float)local_d8._4_4_ + (float)local_d8._4_4_;
  auVar12._8_4_ = fStack_d0 + fStack_d0;
  auVar12._12_4_ = fStack_cc + fStack_cc;
  auVar10._8_4_ = 0xbf800000;
  auVar10._0_8_ = 0xbf800000bf800000;
  auVar10._12_4_ = 0xbf800000;
  auVar12 = vaddps_avx512vl(auVar12,auVar10);
  fVar15 = auVar12._0_4_;
  auVar10 = vmovshdup_avx(auVar12);
  fVar16 = auVar10._0_4_;
  _local_d8 = auVar27._0_16_;
  if (fVar15 == 0.0) {
    auVar17 = ZEXT416(0) << 0x20;
    if ((fVar16 == 0.0) &&
       (auVar13 = ZEXT416((uint)FVar1), auVar14 = ZEXT416((uint)FVar3),
       auVar18 = ZEXT416((uint)FVar2), !NAN(fVar16))) goto LAB_0034fe29;
  }
  auVar17._8_4_ = 0x7fffffff;
  auVar17._0_8_ = 0x7fffffff7fffffff;
  auVar17._12_4_ = 0x7fffffff;
  auVar13 = vandps_avx512vl(auVar12,auVar17);
  local_b8 = ZEXT416((uint)FVar3);
  local_48 = ZEXT416((uint)FVar1);
  local_58 = ZEXT416((uint)FVar2);
  auVar17 = vshufps_avx(auVar13,auVar13,0xf5);
  auVar14._0_4_ = fVar15 / fVar16;
  auVar14._4_12_ = auVar12._4_12_;
  bVar11 = auVar17._0_4_ < auVar13._0_4_;
  auVar12 = vfmadd213ss_fma(SUB6416(ZEXT464(0xbf490fdb),0),auVar14,ZEXT416(0x3fc90fdb));
  local_78._4_12_ = auVar12._4_12_;
  local_78._0_4_ =
       (uint)bVar11 * (int)((fVar16 / fVar15) * 0.7853982) + (uint)!bVar11 * auVar12._0_4_;
  local_68._4_12_ = auVar10._4_12_;
  local_68._0_4_ = (uint)bVar11 * (int)fVar15 + (uint)!bVar11 * (int)fVar16;
  fVar15 = cosf((float)local_78._0_4_);
  fVar16 = sinf((float)local_78._0_4_);
  auVar17 = vinsertps_avx(ZEXT416((uint)((float)local_68._0_4_ * fVar15)),
                          ZEXT416((uint)((float)local_68._0_4_ * fVar16)),0x10);
  auVar13 = local_48;
  auVar14 = local_b8;
  auVar18 = local_58;
LAB_0034fe29:
  auVar12 = vmovshdup_avx(local_88);
  auVar10 = vinsertps_avx(_local_c8,auVar18,0x10);
  fVar15 = this->sceneRadius;
  auVar41._0_4_ = auVar12._0_4_ * auVar10._0_4_;
  auVar41._4_4_ = auVar12._4_4_ * auVar10._4_4_;
  auVar41._8_4_ = auVar12._8_4_ * auVar10._8_4_;
  auVar41._12_4_ = auVar12._12_4_ * auVar10._12_4_;
  uVar24 = local_88._0_4_;
  auVar40._4_4_ = uVar24;
  auVar40._0_4_ = uVar24;
  auVar40._8_4_ = uVar24;
  auVar40._12_4_ = uVar24;
  auVar10 = vinsertps_avx512f((undefined1  [16])local_a8,auVar13,0x10);
  auVar13 = vfmadd213ss_fma(ZEXT416((uint)FVar4),local_88,ZEXT416((uint)(auVar12._0_4_ * fVar5)));
  auVar31._8_4_ = 0x3f800000;
  auVar31._0_8_ = 0x3f8000003f800000;
  auVar31._12_4_ = 0x3f800000;
  auVar12 = vfmadd213ps_fma(auVar40,auVar10,auVar41);
  uVar24 = local_d8._0_4_;
  auVar36._4_4_ = uVar24;
  auVar36._0_4_ = uVar24;
  auVar36._8_4_ = uVar24;
  auVar36._12_4_ = uVar24;
  auVar10 = vinsertps_avx512f(local_98,auVar14,0x10);
  auVar13 = vfmadd213ss_fma(_local_d8,ZEXT416((uint)FVar6),auVar13);
  auVar33._8_4_ = 0x80000000;
  auVar33._0_8_ = 0x8000000080000000;
  auVar33._12_4_ = 0x80000000;
  auVar10 = vfmadd213ps_fma(auVar36,auVar10,auVar12);
  auVar12 = vpternlogd_avx512vl(auVar31,auVar13,auVar33,0xf8);
  _local_d8 = auVar13 ^ auVar33;
  fVar32 = auVar13._0_4_;
  fVar34 = auVar12._0_4_;
  fVar35 = auVar10._0_4_;
  auVar13._0_4_ = -1.0 / (fVar32 + fVar34);
  auVar42._0_4_ = fVar35 * fVar35 * fVar34;
  fVar37 = auVar10._4_4_;
  auVar42._4_4_ = fVar37 * 0.0;
  fVar38 = auVar10._8_4_;
  auVar42._8_4_ = fVar38 * 0.0;
  fVar39 = auVar10._12_4_;
  auVar42._12_4_ = fVar39 * 0.0;
  local_88._0_8_ = auVar10._0_8_ ^ 0x8000000080000000;
  local_88._8_4_ = -fVar38;
  local_88._12_4_ = -fVar39;
  auVar10 = vmovshdup_avx(auVar10);
  fVar16 = auVar17._0_4_;
  fVar5 = fVar35 * auVar10._0_4_ * auVar13._0_4_;
  auVar13._4_4_ = auVar13._0_4_;
  auVar13._8_4_ = auVar13._0_4_;
  auVar13._12_4_ = auVar13._0_4_;
  auVar10 = vinsertps_avx(auVar31,auVar12,0x10);
  auVar13 = vfmadd231ps_fma(auVar10,auVar42,auVar13);
  auVar12 = vshufps_avx(auVar17,auVar17,0xe1);
  auVar14 = vpermi2ps_avx512vl(_DAT_0054e630,ZEXT416((uint)(fVar34 * fVar5)),ZEXT416((uint)fVar5));
  auVar18._0_4_ = fVar35 * fVar16;
  auVar18._4_4_ = fVar37 * auVar17._4_4_;
  auVar18._8_4_ = fVar38 * auVar17._8_4_;
  auVar18._12_4_ = fVar39 * auVar17._12_4_;
  auVar10 = vmovshdup_avx(auVar18);
  uVar7 = (this->sceneCenter).super_Tuple3<pbrt::Point3,_float>.x;
  uVar9 = (this->sceneCenter).super_Tuple3<pbrt::Point3,_float>.y;
  auVar25._0_4_ =
       (float)uVar7 +
       fVar15 * (fVar35 * 0.0 + auVar14._0_4_ * auVar12._0_4_ + auVar13._0_4_ * fVar16);
  auVar25._4_4_ =
       (float)uVar9 +
       fVar15 * (fVar37 * 0.0 + auVar14._4_4_ * auVar12._4_4_ + auVar13._4_4_ * auVar17._4_4_);
  auVar25._8_4_ =
       fVar15 * (fVar38 * 0.0 + auVar14._8_4_ * auVar12._8_4_ + auVar13._8_4_ * auVar17._8_4_) + 0.0
  ;
  auVar25._12_4_ =
       fVar15 * (fVar39 * 0.0 + auVar14._12_4_ * auVar12._12_4_ + auVar13._12_4_ * auVar17._12_4_) +
       0.0;
  auVar30 = ZEXT856(auVar25._8_8_);
  local_b8._0_4_ =
       fVar15 * fVar32 +
       fVar15 * (fVar32 * 0.0 + (fVar35 * -fVar34 * fVar16 - auVar10._0_4_)) +
       (this->sceneCenter).super_Tuple3<pbrt::Point3,_float>.z;
  local_c8._4_4_ = fVar37 * fVar15 + auVar25._4_4_;
  local_c8._0_4_ = fVar35 * fVar15 + auVar25._0_4_;
  fStack_c0 = fVar38 * fVar15 + auVar25._8_4_;
  fStack_bc = fVar39 * fVar15 + auVar25._12_4_;
  local_98 = ZEXT416((uint)(fVar15 * fVar15 * 3.1415927));
  local_a8 = (Float  [4])vinsertps_avx(auVar31,ZEXT416((uint)local_dc),0x10);
  auVar23 = ZEXT856((ulong)local_38._8_8_);
  SVar44 = Le(this,(Point2f)local_38._0_8_,lambda);
  auVar28._0_8_ = SVar44.values.values._8_8_;
  auVar28._8_56_ = auVar30;
  auVar22._0_8_ = SVar44.values.values._0_8_;
  auVar22._8_56_ = auVar23;
  auVar10 = vmovlhps_avx(auVar22._0_16_,auVar28._0_16_);
  __return_storage_ptr__->set = true;
  *(undefined1 (*) [16])&__return_storage_ptr__->optionalValue = auVar10;
  uVar8 = vmovlps_avx(_local_c8);
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = uVar8;
  *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0x18) = local_b8._0_4_;
  uVar8 = vmovlps_avx(local_88);
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x1c) = uVar8;
  *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0x24) = local_d8._0_4_;
  *(Float *)((long)&__return_storage_ptr__->optionalValue + 0x28) = time;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = 0;
  (__return_storage_ptr__->optionalValue).__data[0x88] = '\0';
  auVar10 = vblendps_avx(local_98,_DAT_00567590,0xe);
  auVar10 = vdivps_avx((undefined1  [16])local_a8,auVar10);
  uVar8 = vmovlps_avx(auVar10);
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x90) = uVar8;
  return __return_storage_ptr__;
}

Assistant:

pstd::optional<LightLeSample> ImageInfiniteLight::SampleLe(Point2f u1, Point2f u2,
                                                           SampledWavelengths &lambda,
                                                           Float time) const {
    // Sample infinite light image and compute ray direction _w_
    Float mapPDF;
    Point2f uv = distribution.Sample(u1, &mapPDF);
    Vector3f wl = EqualAreaSquareToSphere(uv);
    Vector3f w = -renderFromLight(wl);

    // Compute infinite light sample ray
    Frame wFrame = Frame::FromZ(-w);
    Point2f cd = SampleUniformDiskConcentric(u2);
    Point3f pDisk = sceneCenter + sceneRadius * wFrame.FromLocal(Vector3f(cd.x, cd.y, 0));
    Ray ray(pDisk + sceneRadius * -w, w, time);

    // Compute _ImageInfiniteLight_ ray PDFs
    Float pdfDir = mapPDF / (4 * Pi);
    Float pdfPos = 1 / (Pi * Sqr(sceneRadius));

    return LightLeSample(Le(uv, lambda), ray, pdfPos, pdfDir);
}